

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O1

Var Js::JavascriptObject::EntryToLocaleString(RecyclableObject *function,CallInfo callInfo,...)

{
  ImplicitCallFlags IVar1;
  ScriptContext *pSVar2;
  ThreadContext *this;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  Attributes attributes;
  undefined4 *puVar7;
  Var pvVar8;
  JavascriptFunction *function_00;
  JavascriptMethod p_Var9;
  RecyclableObject *ptr;
  int in_stack_00000010;
  undefined1 local_60 [8];
  ArgumentReader args;
  RecyclableObject *dynamicObject;
  CallInfo callInfo_local;
  Var toStringVar;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  dynamicObject = (RecyclableObject *)callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != (int)dynamicObject) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x175,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00cefe25;
    *puVar7 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_60 = (undefined1  [8])dynamicObject;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_60,(CallInfo *)&dynamicObject);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)dynamicObject & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x177,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00cefe25;
    *puVar7 = 0;
  }
  if (((ulong)local_60 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x178,"(args.Info.Count)","Should always have implicit \'this\'");
    if (!bVar4) {
LAB_00cefe25:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  pvVar8 = Arguments::operator[]((Arguments *)local_60,0);
  args.super_Arguments.Values = (Type)0x0;
  BVar6 = JavascriptConversion::ToObject
                    (pvVar8,pSVar2,(RecyclableObject **)&args.super_Arguments.Values);
  if (BVar6 == 0) {
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec42,L"Object.prototype.toLocaleString");
  }
  callInfo_local = (CallInfo)0x0;
  BVar6 = JavascriptOperators::GetProperty
                    (pvVar8,(RecyclableObject *)args.super_Arguments.Values,0x178,
                     (Var *)&callInfo_local,pSVar2,(PropertyValueInfo *)0x0);
  if ((BVar6 == 0) || (bVar4 = JavascriptConversion::IsCallable((Var)callInfo_local), !bVar4)) {
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec34,L"Object.prototype.toLocaleString");
  }
  function_00 = (JavascriptFunction *)VarTo<Js::RecyclableObject>((Var)callInfo_local);
  if (function_00 ==
      (((pSVar2->super_ScriptContextBase).javascriptLibrary)->objectToStringFunction).ptr) {
    pvVar8 = ToStringHelper(pvVar8,pSVar2);
    return pvVar8;
  }
  this = pSVar2->threadContext;
  bVar4 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function_00);
  bVar5 = ThreadContext::HasNoSideEffect(this,(RecyclableObject *)function_00,attributes);
  if (bVar5) {
    ThreadContext::CheckAndResetReentrancySafeOrHandled(pSVar2->threadContext);
    if (pSVar2->threadContext->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function_00);
    CheckIsExecutable((RecyclableObject *)function_00,p_Var9);
    p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function_00);
    ptr = (RecyclableObject *)
          (*p_Var9)((RecyclableObject *)function_00,(CallInfo)function_00,0x2000001,0,0,0,0,
                    0x2000001,pvVar8);
    bVar5 = ThreadContext::IsOnStack(ptr);
  }
  else {
    if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_ToPrimitive;
      ptr = (((((((((function_00->super_DynamicObject).super_RecyclableObject.type.ptr)->
                  javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
              super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
            undefinedValue.ptr;
      goto LAB_00cefd7e;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this->implicitCallFlags;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(pSVar2->threadContext);
      if (pSVar2->threadContext->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function_00);
      CheckIsExecutable((RecyclableObject *)function_00,p_Var9);
      p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function_00);
      ptr = (RecyclableObject *)
            (*p_Var9)((RecyclableObject *)function_00,(CallInfo)function_00,0x2000001,0,0,0,0,
                      0x2000001,pvVar8);
      this->implicitCallFlags = IVar1 | ImplicitCall_ToPrimitive;
      goto LAB_00cefd7e;
    }
    ThreadContext::CheckAndResetReentrancySafeOrHandled(pSVar2->threadContext);
    if (pSVar2->threadContext->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function_00);
    CheckIsExecutable((RecyclableObject *)function_00,p_Var9);
    p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function_00);
    ptr = (RecyclableObject *)
          (*p_Var9)((RecyclableObject *)function_00,(CallInfo)function_00,0x2000001,0,0,0,0,
                    0x2000001,pvVar8);
    bVar5 = ThreadContext::IsOnStack(ptr);
  }
  if (bVar5 != false) {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_ToPrimitive;
  }
LAB_00cefd7e:
  this->reentrancySafeOrHandled = bVar4;
  return ptr;
}

Assistant:

Var JavascriptObject::EntryToLocaleString(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();
    Assert(!(callInfo.Flags & CallFlags_New));
    AssertMsg(args.Info.Count, "Should always have implicit 'this'");

    Var thisValue = args[0];
    RecyclableObject* dynamicObject = nullptr;

    if (FALSE == JavascriptConversion::ToObject(thisValue, scriptContext, &dynamicObject))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Object.prototype.toLocaleString"));
    }

    Var toStringVar = nullptr;
    if (!JavascriptOperators::GetProperty(thisValue, dynamicObject, Js::PropertyIds::toString, &toStringVar, scriptContext) || !JavascriptConversion::IsCallable(toStringVar))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Object.prototype.toLocaleString"));
    }

    RecyclableObject* toStringFunc = VarTo<RecyclableObject>(toStringVar);
    if (toStringFunc == scriptContext->GetLibrary()->GetObjectToStringFunction())
    {
        return ToStringHelper(thisValue, scriptContext);
    }
    else
    {
        return scriptContext->GetThreadContext()->ExecuteImplicitCall(toStringFunc, Js::ImplicitCall_ToPrimitive, [=]()->Js::Var
        {
            return CALL_FUNCTION(scriptContext->GetThreadContext(), toStringFunc, CallInfo(CallFlags_Value, 1), thisValue);
        });
    }
}